

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O1

Sexp * AnalyzeShortCircuit(Sexp *form)

{
  Meaning *pMVar1;
  Sexp *pSVar2;
  undefined8 *puVar3;
  ContractFrameProtector CVar4;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  vector<Sexp_*,_std::allocator<Sexp_*>_> local_b8;
  vector<Sexp_*,_std::allocator<Sexp_*>_> local_98;
  undefined1 auStack_78 [8];
  vector<Sexp_*,_std::allocator<Sexp_*>_> args;
  uint *local_58;
  undefined8 local_50;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ContractFrameProtector local_38;
  ContractFrameProtector __contract_frame;
  Sexp *form_local;
  FrameProtector __frame_prot;
  
  __contract_frame.protected_frame = (ContractFrame *)form;
  ContractFrameProtector::ContractFrameProtector(&local_38,"AnalyzeShortCircuit");
  ContractFrame::CheckPrecondition
            (local_38.protected_frame,(__contract_frame.protected_frame)->restrictions == NoGc,
             "form->IsCons()");
  if (((__contract_frame.protected_frame)->restrictions != NoGc) ||
     (ContractFrame::CheckPrecondition
                (local_38.protected_frame,
                 *(int *)(__contract_frame.protected_frame)->function_name == 2,
                 "form->Car()->IsSymbol()"),
     (__contract_frame.protected_frame)->restrictions != NoGc)) {
LAB_001164bd:
    __assert_fail("IsCons()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.h"
                  ,200,"Sexp *Sexp::Car() const");
  }
  ContractFrame::CheckPrecondition
            (local_38.protected_frame,
             (*(ulong *)((__contract_frame.protected_frame)->function_name + 8) & 0xfffffffffffffffe
             ) == 0xc,
             "form->Car()->symbol_value == SymbolInterner::And || form->Car()->symbol_value == SymbolInterner::Or"
            );
  FrameProtector::FrameProtector((FrameProtector *)&form_local,"AnalyzeShortCircuit");
  FrameProtector::ProtectValue((FrameProtector *)&form_local,(Sexp **)&__contract_frame,"form");
  auStack_78 = (undefined1  [8])0x0;
  args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  FrameProtector::ProtectVector
            ((FrameProtector *)&form_local,(vector<Sexp_*,_std::allocator<Sexp_*>_> *)auStack_78,
             "args");
  CVar4 = __contract_frame;
  if ((__contract_frame.protected_frame)->restrictions == NoGc) {
    for (; (CVar4.protected_frame)->restrictions == NoGc;
        CVar4.protected_frame = (CVar4.protected_frame)->parent) {
    }
    if ((CVar4.protected_frame)->restrictions == None) {
      local_d8._8_8_ = 0;
      pcStack_c0 = std::
                   _Function_handler<void_(Sexp_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/analysis.cpp:623:7)>
                   ::_M_invoke;
      local_c8 = std::
                 _Function_handler<void_(Sexp_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/analysis.cpp:623:7)>
                 ::_M_manager;
      local_d8._M_unused._M_object = (vector<Sexp_*,_std::allocator<Sexp_*>_> *)auStack_78;
      Sexp::ForEach((Sexp *)(__contract_frame.protected_frame)->parent,
                    (function<void_(Sexp_*)> *)&local_d8);
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,__destroy_functor);
      }
      if ((__contract_frame.protected_frame)->restrictions == NoGc) {
        if (*(long *)((__contract_frame.protected_frame)->function_name + 8) == 0xd) {
          pMVar1 = (Meaning *)operator_new(0x20);
          std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
                    (&local_98,(vector<Sexp_*,_std::allocator<Sexp_*>_> *)auStack_78);
          pMVar1->_vptr_Meaning = (_func_int **)&PTR_Eval_00126c10;
          pMVar1[1]._vptr_Meaning =
               (_func_int **)
               local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          pMVar1[2]._vptr_Meaning =
               (_func_int **)
               local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pMVar1[3]._vptr_Meaning =
               (_func_int **)
               local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          FrameProtector::ProtectVector
                    ((FrameProtector *)&form_local,
                     (vector<Sexp_*,_std::allocator<Sexp_*>_> *)(pMVar1 + 1),"meaning->Arguments()")
          ;
          pSVar2 = GcHeap::AllocateMeaning(pMVar1);
        }
        else {
          if (*(long *)((__contract_frame.protected_frame)->function_name + 8) != 0xc) {
            __assert_fail("form->Car()->symbol_value == SymbolInterner::Or",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/analysis.cpp"
                          ,0x276,"Sexp *AnalyzeShortCircuit(Sexp *)");
          }
          pMVar1 = (Meaning *)operator_new(0x20);
          std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
                    (&local_b8,(vector<Sexp_*,_std::allocator<Sexp_*>_> *)auStack_78);
          pMVar1->_vptr_Meaning = (_func_int **)&PTR_Eval_00126bc0;
          pMVar1[1]._vptr_Meaning =
               (_func_int **)
               local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          pMVar1[2]._vptr_Meaning =
               (_func_int **)
               local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pMVar1[3]._vptr_Meaning =
               (_func_int **)
               local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          FrameProtector::ProtectVector
                    ((FrameProtector *)&form_local,
                     (vector<Sexp_*,_std::allocator<Sexp_*>_> *)(pMVar1 + 1),"meaning->Arguments()")
          ;
          pSVar2 = GcHeap::AllocateMeaning(pMVar1);
        }
        if (auStack_78 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_78,
                          (long)args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)auStack_78);
        }
        FrameProtector::~FrameProtector((FrameProtector *)&form_local);
        ContractFrameProtector::~ContractFrameProtector(&local_38);
        return pSVar2;
      }
      goto LAB_001164bd;
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"invalid short-circuiting form","");
  *puVar3 = &PTR__JetRuntimeException_00126918;
  puVar3[1] = puVar3 + 3;
  if (local_58 == &local_48) {
    *(uint *)(puVar3 + 3) = local_48;
    *(undefined4 *)((long)puVar3 + 0x1c) = uStack_44;
    *(undefined4 *)(puVar3 + 4) = uStack_40;
    *(undefined4 *)((long)puVar3 + 0x24) = uStack_3c;
  }
  else {
    puVar3[1] = local_58;
    puVar3[3] = CONCAT44(uStack_44,local_48);
  }
  puVar3[2] = local_50;
  local_50 = 0;
  local_48 = local_48 & 0xffffff00;
  local_58 = &local_48;
  __cxa_throw(puVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

Sexp *AnalyzeShortCircuit(Sexp *form) {
  CONTRACT {
    PRECONDITION(form->IsCons());
    PRECONDITION(form->Car()->IsSymbol());
    PRECONDITION(form->Car()->symbol_value == SymbolInterner::And ||
                 form->Car()->symbol_value == SymbolInterner::Or);
  }